

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

void __thiscall Editor::saveAsBoard(Editor *this,path *filename,bool overwriteFile)

{
  format_string_t<ghc::filesystem::path_&> fmt;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  byte in_DL;
  EditorInterface *in_RDI;
  path saveFilename;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  string *in_stack_fffffffffffffbc0;
  Board *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  format in_stack_fffffffffffffbd4;
  char (*in_stack_fffffffffffffbd8) [5];
  path *in_stack_fffffffffffffbe0;
  Board *in_stack_fffffffffffffbe8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbf0;
  iterator in_stack_fffffffffffffbf8;
  size_type in_stack_fffffffffffffc00;
  string *psVar2;
  string *local_3f8;
  string *local_378;
  undefined6 in_stack_fffffffffffffce8;
  byte in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  basic_string_view<char> local_308;
  undefined4 local_2f8;
  undefined1 local_2f3;
  allocator local_2f2;
  allocator local_2f1;
  string *local_2f0;
  string local_2e8 [32];
  string local_2c8 [32];
  string *local_2a8;
  undefined8 local_2a0;
  string local_280 [39];
  allocator local_259;
  string local_258 [48];
  string local_228 [99];
  undefined1 local_1c5;
  allocator local_1c4;
  allocator local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  string *local_1c0;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string *local_138;
  undefined8 local_130;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [40];
  path *in_stack_ffffffffffffff40;
  string local_b8 [7];
  undefined1 in_stack_ffffffffffffff4f;
  EditorInterface *in_stack_ffffffffffffff50;
  byte local_21;
  
  local_21 = in_DL & 1;
  ghc::filesystem::path::path((path *)0x1926af);
  bVar1 = ghc::filesystem::path::empty((path *)0x1926bc);
  if (bVar1) {
    in_stack_fffffffffffffcef = pfd::settings::available();
    if (!(bool)in_stack_fffffffffffffcef) {
      spdlog::warn<char[113]>((char (*) [113])0x1931fa);
      Board::getFilename((Board *)0x193219);
      EditorInterface::showFileDialog
                (in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff40
                );
      local_2f8 = 1;
      goto LAB_00193352;
    }
    Board::getDefaultFileExtension(in_stack_fffffffffffffbc8);
    ghc::filesystem::path::path<char[5],ghc::filesystem::path>
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4);
    in_stack_fffffffffffffcee =
         ghc::filesystem::operator==
                   ((path *)in_stack_fffffffffffffbc0,
                    (path *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    ghc::filesystem::path::~path((path *)0x192772);
    ghc::filesystem::path::~path((path *)0x19277f);
    if ((in_stack_fffffffffffffcee & 1) == 0) {
      Board::getDefaultFileExtension(in_stack_fffffffffffffbc8);
      ghc::filesystem::path::path<char[1],ghc::filesystem::path>
                (in_stack_fffffffffffffbe0,(char (*) [1])in_stack_fffffffffffffbd8,
                 in_stack_fffffffffffffbd4);
      bVar1 = ghc::filesystem::operator==
                        ((path *)in_stack_fffffffffffffbc0,
                         (path *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      ghc::filesystem::path::~path((path *)0x192d84);
      ghc::filesystem::path::~path((path *)0x192d91);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_258,"Save As",&local_259);
        Board::getFilename((Board *)0x192de5);
        ghc::filesystem::path::string_abi_cxx11_((path *)in_stack_fffffffffffffbc8);
        local_2f3 = 1;
        local_2f0 = local_2e8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e8,"All Files (*.*)",&local_2f1);
        local_2f0 = local_2c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2c8,"*",&local_2f2);
        local_2f3 = 0;
        local_2a8 = local_2e8;
        local_2a0 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x192ec2);
        __l_00._M_len = in_stack_fffffffffffffc00;
        __l_00._M_array = in_stack_fffffffffffffbf8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(in_stack_fffffffffffffbf0,__l_00,(allocator_type *)in_stack_fffffffffffffbe8);
        pfd::save_file::save_file
                  ((save_file *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (string *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),none);
        pfd::save_file::result_abi_cxx11_
                  ((save_file *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
        ghc::filesystem::path::operator=
                  ((path *)in_stack_fffffffffffffbc0,
                   (string_type *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
        std::__cxx11::string::~string(local_228);
        pfd::save_file::~save_file((save_file *)0x192f58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x192f72);
        psVar2 = local_2e8;
        local_3f8 = (string *)&local_2a8;
        do {
          local_3f8 = local_3f8 + -0x20;
          std::__cxx11::string::~string(local_3f8);
        } while (local_3f8 != psVar2);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f2);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::string::~string(local_258);
        std::allocator<char>::~allocator((allocator<char> *)&local_259);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"Save As",&local_e9);
      Board::getFilename((Board *)0x1927d3);
      ghc::filesystem::path::string_abi_cxx11_((path *)in_stack_fffffffffffffbc8);
      local_1c5 = 1;
      local_1c0 = local_1b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"Plain Text (*.txt)",&local_1c1);
      local_1c0 = local_198;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"*.txt",&local_1c2);
      local_1c0 = local_178;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"All Files (*.*)",&local_1c3);
      local_1c0 = local_158;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"*",&local_1c4);
      local_1c5 = 0;
      local_138 = local_1b8;
      local_130 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x192961);
      __l._M_len = in_stack_fffffffffffffc00;
      __l._M_array = in_stack_fffffffffffffbf8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffbf0,__l,(allocator_type *)in_stack_fffffffffffffbe8);
      pfd::save_file::save_file
                ((save_file *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (string *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),none);
      pfd::save_file::result_abi_cxx11_
                ((save_file *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      ghc::filesystem::path::operator=
                ((path *)in_stack_fffffffffffffbc0,
                 (string_type *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      std::__cxx11::string::~string(local_b8);
      pfd::save_file::~save_file((save_file *)0x1929fa);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x192a14);
      local_378 = (string *)&local_138;
      do {
        local_378 = local_378 + -0x20;
        std::__cxx11::string::~string(local_378);
      } while (local_378 != local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c4);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c3);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c2);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    local_21 = 1;
  }
  else {
    ghc::filesystem::path::operator=
              ((path *)in_stack_fffffffffffffbc0,
               (path *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
  }
  bVar1 = ghc::filesystem::path::empty((path *)0x193252);
  if (bVar1) {
    spdlog::info<char[18]>((char (*) [18])0x193343);
  }
  else {
    if ((local_21 == 0) &&
       (bVar1 = ghc::filesystem::exists((path *)in_stack_fffffffffffffbc0), bVar1)) {
      EditorInterface::showOverwriteDialog
                (in_RDI,(path *)CONCAT17(in_stack_fffffffffffffcef,
                                         CONCAT16(in_stack_fffffffffffffcee,
                                                  in_stack_fffffffffffffce8)));
      local_2f8 = 1;
      goto LAB_00193352;
    }
    ::fmt::v11::basic_string_view<char>::basic_string_view(&local_308,"Saving to \"{}\"...",0x11);
    fmt.str.size_._0_4_ = in_stack_fffffffffffffbd0;
    fmt.str.data_ = (char *)in_stack_fffffffffffffbc8;
    fmt.str.size_._4_4_ = in_stack_fffffffffffffbd4;
    spdlog::info<ghc::filesystem::path&>(fmt,(path *)in_stack_fffffffffffffbc0);
    Board::saveAsFile(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    in_RDI[0x19].debugWidgets_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         in_RDI[0x19].debugWidgets_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  local_2f8 = 0;
LAB_00193352:
  ghc::filesystem::path::~path((path *)0x19335f);
  return;
}

Assistant:

void Editor::saveAsBoard(const fs::path& filename, bool overwriteFile) {
    fs::path saveFilename;
    if (!filename.empty()) {
        saveFilename = filename;
    } else if (pfd::settings::available()) {
        if (board_.getDefaultFileExtension() == ".txt") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "Plain Text (*.txt)", "*.txt",
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else if (board_.getDefaultFileExtension() == "") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else {
            assert(false);
        }

        // The pfd call will prompt the user if overwriting, so skip our check for existing file.
        overwriteFile = true;
    } else {
        spdlog::warn("Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog.");
        return interface_.showFileDialog(false, board_.getFilename());
    }

    if (!saveFilename.empty()) {
        if (!overwriteFile && fs::exists(saveFilename)) {
            return interface_.showOverwriteDialog(saveFilename);
        }

        spdlog::info("Saving to \"{}\"...", saveFilename);
        board_.saveAsFile(saveFilename);
        savedEditSize_ = lastEditSize_;
    } else {
        spdlog::info("No file selected.");
    }
}